

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O1

void Bmc_CexCarePropagateFwdOne(Gia_Man_t *p,Abc_Cex_t *pCex,int f,int fGrow)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  
  pVVar2 = p->vCis;
  uVar5 = pVVar2->nSize;
  uVar15 = uVar5 - p->nRegs;
  if ((fGrow & 2U) == 0) {
    if (0 < (int)uVar15) {
      uVar14 = 0;
      uVar12 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar12 = uVar14;
      }
      do {
        if (uVar12 == uVar14) {
LAB_00516ee2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = pVVar2->pArray[uVar14];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00516ea4;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        iVar21 = pCex->nPis * f;
        iVar18 = (int)uVar14 + iVar21;
        if (iVar18 < -1) {
LAB_00516f01:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        uVar5 = pCex->nRegs + (int)uVar14 + iVar21;
        p->pObjs[iVar10].Value =
             (uint)(((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) + iVar18 * 2
             + 2;
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
  }
  else if (0 < (int)uVar15) {
    uVar14 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar14;
    }
    iVar10 = -1;
    uVar20 = 0;
    do {
      if (uVar12 == uVar20) goto LAB_00516ee2;
      iVar18 = pVVar2->pArray[uVar20];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_00516ea4;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar21 = pCex->nPis;
      if ((f + 1) * iVar21 + iVar10 < -1) goto LAB_00516f01;
      uVar5 = iVar21 * f + pCex->nRegs + (int)uVar20;
      p->pObjs[iVar18].Value =
           (f * 2 + 2) * iVar21 +
           (uint)(((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) + (int)uVar14;
      uVar20 = uVar20 + 1;
      uVar14 = (ulong)((int)uVar14 - 2);
      iVar10 = iVar10 + -1;
    } while (uVar15 != uVar20);
  }
  uVar5 = p->nObjs;
  uVar12 = (ulong)uVar5;
  if ((0 < (int)uVar5) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar7 = &p->pObjs->Value;
    do {
      uVar14 = *(ulong *)(puVar7 + -2);
      if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
        uVar15 = *(uint *)((long)puVar7 + (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3);
        if (((int)uVar15 < 0) ||
           (uVar16 = *(uint *)((long)puVar7 + (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar16 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar19 = uVar15 >> 1;
        uVar8 = uVar16 >> 1;
        uVar22 = uVar15 & 1;
        uVar4 = (uint)(uVar14 >> 0x1d);
        uVar17 = uVar4 & 1;
        uVar16 = uVar16 & 1;
        uVar13 = (uint)(uVar14 >> 0x3d) & 1;
        if ((uVar22 == uVar17) || (uVar16 == uVar13)) {
          if (((uVar22 == uVar17) || (uVar9 = uVar8, uVar16 != uVar13)) &&
             ((uVar22 != uVar17 || (uVar9 = uVar19, uVar16 == uVar13)))) {
            if ((fGrow & 1U) == 0) goto LAB_00516e07;
            goto LAB_00516dde;
          }
        }
        else if ((fGrow & 1U) == 0) {
LAB_00516dde:
          uVar9 = uVar8;
          if (uVar8 < uVar19) {
            uVar9 = uVar19;
          }
        }
        else {
LAB_00516e07:
          uVar9 = uVar8;
          if (uVar19 < uVar8) {
            uVar9 = uVar19;
          }
        }
        *puVar7 = ((uVar16 ^ uVar13) & (uVar15 ^ uVar4 & 7)) + uVar9 * 2;
      }
      puVar7 = puVar7 + 3;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  lVar6 = (long)p->vCos->nSize;
  if (0 < lVar6) {
    piVar3 = p->vCos->pArray;
    lVar11 = 0;
    do {
      iVar10 = piVar3[lVar11];
      if (((long)iVar10 < 0) || ((int)uVar5 <= iVar10)) {
LAB_00516ea4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar10;
      if ((int)pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      pGVar1->Value =
           (uint)*(undefined8 *)pGVar1 >> 0x1d & 1 ^
           pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value;
      lVar11 = lVar11 + 1;
    } while (lVar6 != lVar11);
  }
  return;
}

Assistant:

void Bmc_CexCarePropagateFwdOne( Gia_Man_t * p, Abc_Cex_t * pCex, int f, int fGrow )
{
    Gia_Obj_t * pObj;
    int Prio, Prio0, Prio1;
    int i, Phase0, Phase1;
    if ( (fGrow & 2) )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + (pCex->nPis-1-i) + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + i + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Prio0  = Abc_Lit2Var(Gia_ObjFanin0(pObj)->Value);
        Prio1  = Abc_Lit2Var(Gia_ObjFanin1(pObj)->Value);
        Phase0 = Abc_LitIsCompl(Gia_ObjFanin0(pObj)->Value) ^ Gia_ObjFaninC0(pObj);
        Phase1 = Abc_LitIsCompl(Gia_ObjFanin1(pObj)->Value) ^ Gia_ObjFaninC1(pObj);
        if ( Phase0 && Phase1 )
            Prio = (fGrow & 1) ? Abc_MinInt(Prio0, Prio1) : Abc_MaxInt(Prio0, Prio1);
        else if ( Phase0 && !Phase1 )
            Prio = Prio1;
        else if ( !Phase0 && Phase1 )
            Prio = Prio0;
        else // if ( !Phase0 && !Phase1 )
            Prio = (fGrow & 1) ? Abc_MaxInt(Prio0, Prio1) : Abc_MinInt(Prio0, Prio1);
        pObj->Value = Abc_Var2Lit( Prio, Phase0 & Phase1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
}